

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SparseBitVector.h
# Opt level: O2

BVSparseNode * __thiscall
BVSparse<Memory::JitArenaAllocator>::NodeFromIndex
          (BVSparse<Memory::JitArenaAllocator> *this,BVIndex i,Type **prevNextFieldOut,bool create)

{
  BVSparse<Memory::JitArenaAllocator> *pBVar1;
  BVSparse<Memory::JitArenaAllocator> *nextNode;
  uint searchIndex;
  BVSparse<Memory::JitArenaAllocator> *pBVar2;
  
  searchIndex = i & 0xffffffc0;
  pBVar2 = (BVSparse<Memory::JitArenaAllocator> *)this->lastUsedNodePrevNextField;
  pBVar1 = (BVSparse<Memory::JitArenaAllocator> *)pBVar2->head;
  if (pBVar1 != (BVSparse<Memory::JitArenaAllocator> *)0x0) {
    if (*(uint *)&pBVar1->lastFoundIndex == searchIndex) {
      *prevNextFieldOut = (Type *)pBVar2;
      return (BVSparseNode *)pBVar1;
    }
    if (*(uint *)&pBVar1->lastFoundIndex <= searchIndex) goto LAB_003dcb95;
  }
  pBVar1 = (BVSparse<Memory::JitArenaAllocator> *)this->head;
  pBVar2 = this;
LAB_003dcb95:
  do {
    nextNode = pBVar1;
    if (nextNode == (BVSparse<Memory::JitArenaAllocator> *)0x0) {
LAB_003dcba9:
      if (create) {
        nextNode = (BVSparse<Memory::JitArenaAllocator> *)
                   Allocate(this,searchIndex,(BVSparseNode *)nextNode);
        pBVar2->head = (Type_conflict)nextNode;
LAB_003dcbbb:
        *prevNextFieldOut = &pBVar2->head;
        this->lastUsedNodePrevNextField = &pBVar2->head;
      }
      else {
        nextNode = (BVSparse<Memory::JitArenaAllocator> *)0x0;
      }
      return (BVSparseNode *)nextNode;
    }
    if (searchIndex <= *(uint *)&nextNode->lastFoundIndex) {
      if (searchIndex == *(uint *)&nextNode->lastFoundIndex) goto LAB_003dcbbb;
      goto LAB_003dcba9;
    }
    pBVar1 = (BVSparse<Memory::JitArenaAllocator> *)nextNode->head;
    pBVar2 = nextNode;
  } while( true );
}

Assistant:

BVSparseNode<TAllocator> *
BVSparse<TAllocator>::NodeFromIndex(BVIndex i, Field(BVSparseNode*, TAllocator)** prevNextFieldOut, bool create)
{
    const BVIndex searchIndex = SparseBVUnit::Floor(i);

    Field(BVSparseNode*, TAllocator)* prevNextField = this->lastUsedNodePrevNextField;
    BVSparseNode* curNode = *prevNextField;
    if (curNode != nullptr)
    {
        if (curNode->startIndex == searchIndex)
        {
            *prevNextFieldOut = prevNextField;
            return curNode;
        }

        if (curNode->startIndex > searchIndex)
        {
            prevNextField = &this->head;
            curNode = this->head;
        }
    }
    else
    {
        prevNextField = &this->head;
        curNode = this->head;
    }

    for (; curNode && searchIndex > curNode->startIndex; curNode = curNode->next)
    {
        prevNextField = &curNode->next;
    }

    if(curNode && searchIndex == curNode->startIndex)
    {
        *prevNextFieldOut = prevNextField;
        this->lastUsedNodePrevNextField = prevNextField;
        return curNode;
    }

    if(!create)
    {
        return nullptr;
    }

    BVSparseNode * newNode = Allocate(searchIndex, *prevNextField);
    *prevNextField = newNode;
    *prevNextFieldOut = prevNextField;
    this->lastUsedNodePrevNextField = prevNextField;
    return newNode;
}